

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.c
# Opt level: O2

Variable * var_ht_get(VarHashTable *ht,VarHTItemKey key)

{
  _Bool _Var1;
  uint32_t uVar2;
  VarHTItem *pVVar3;
  
  uVar2 = hash_string(key.key_ident_string,key.ident_length);
  pVVar3 = ht->buckets[ht->cap - 1 & uVar2];
  if (pVVar3 != (VarHTItem *)0x0) {
    for (; pVVar3 != (VarHTItem *)0x0; pVVar3 = pVVar3->next) {
      _Var1 = equals(pVVar3->key,key);
      if (_Var1) {
        return &pVVar3->value;
      }
    }
  }
  return (Variable *)0x0;
}

Assistant:

Variable *var_ht_get(VarHashTable *ht, VarHTItemKey key) {
    uint32_t index = var_hash(key) & (ht->cap - 1);

    if (ht->buckets[index] != NULL) {
        Variable *value = find(ht->buckets[index], key);
        if (value) {
            return value;
        }
    }

    return NULL;
}